

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

char * __thiscall Fl_Text_Buffer::line_text(Fl_Text_Buffer *this,int pos)

{
  int start;
  int end;
  char *pcVar1;
  int pos_local;
  Fl_Text_Buffer *this_local;
  
  start = line_start(this,pos);
  end = line_end(this,pos);
  pcVar1 = text_range(this,start,end);
  return pcVar1;
}

Assistant:

char *Fl_Text_Buffer::line_text(int pos) const {
  return text_range(line_start(pos), line_end(pos));
}